

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::BVHNIntersector1<4,_16781328,_false,_embree::avx2::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char cVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  vint4 bi_4;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vint4 ai_1;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 ai_3;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  vint4 ai;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 uVar37;
  vint4 ai_2;
  undefined1 auVar38 [16];
  vint4 ai_4;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vfloat4 a0;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 bi_2;
  vint4 bi;
  Precalculations pre;
  NodeRef stack [244];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      aVar6 = (ray->dir).field_0.field_1;
      auVar39 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
      auVar26 = vrsqrtss_avx(auVar39,auVar39);
      fVar43 = auVar26._0_4_;
      local_818[0] = fVar43 * 1.5 - auVar39._0_4_ * 0.5 * fVar43 * fVar43 * fVar43;
      uVar2 = *(undefined4 *)&(ray->dir).field_0;
      auVar47._0_4_ = aVar6.x * local_818[0];
      auVar47._4_4_ = aVar6.y * local_818[0];
      auVar47._8_4_ = aVar6.z * local_818[0];
      auVar47._12_4_ = aVar6.field_3.w * local_818[0];
      auVar26 = vshufpd_avx(auVar47,auVar47,1);
      auVar32._8_4_ = 0x80000000;
      auVar32._0_8_ = 0x8000000080000000;
      auVar32._12_4_ = 0x80000000;
      auVar39 = vmovshdup_avx(auVar47);
      auVar55._0_4_ = auVar39._0_4_ ^ 0x80000000;
      auVar45 = ZEXT816(0) << 0x40;
      auVar39 = vunpckhps_avx(auVar47,auVar45);
      auVar55._4_12_ = ZEXT812(0) << 0x20;
      auVar44 = vshufps_avx(auVar39,auVar55,0x41);
      auVar52._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      auVar52._8_8_ = auVar26._8_8_ ^ auVar32._8_8_;
      auVar32 = vinsertps_avx(auVar52,auVar47,0x2a);
      auVar39 = vdpps_avx(auVar44,auVar44,0x7f);
      auVar26 = vdpps_avx(auVar32,auVar32,0x7f);
      auVar39 = vcmpps_avx(auVar26,auVar39,1);
      auVar57._0_4_ = auVar39._0_4_;
      auVar57._4_4_ = auVar57._0_4_;
      auVar57._8_4_ = auVar57._0_4_;
      auVar57._12_4_ = auVar57._0_4_;
      auVar39 = vblendvps_avx(auVar32,auVar44,auVar57);
      auVar26 = vdpps_avx(auVar39,auVar39,0x7f);
      uVar3 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar32 = vrsqrtss_avx(auVar26,auVar26);
      fVar34 = auVar32._0_4_;
      fVar43 = (ray->dir).field_0.m128[2];
      fVar34 = fVar34 * 1.5 - auVar26._0_4_ * 0.5 * fVar34 * fVar34 * fVar34;
      auVar53._0_4_ = auVar39._0_4_ * fVar34;
      auVar53._4_4_ = auVar39._4_4_ * fVar34;
      auVar53._8_4_ = auVar39._8_4_ * fVar34;
      auVar53._12_4_ = auVar39._12_4_ * fVar34;
      auVar39 = vshufps_avx(auVar53,auVar53,0xc9);
      auVar26 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar58._0_4_ = auVar53._0_4_ * auVar26._0_4_;
      auVar58._4_4_ = auVar53._4_4_ * auVar26._4_4_;
      auVar58._8_4_ = auVar53._8_4_ * auVar26._8_4_;
      auVar58._12_4_ = auVar53._12_4_ * auVar26._12_4_;
      auVar39 = vfmsub231ps_fma(auVar58,auVar47,auVar39);
      auVar32 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar39 = vdpps_avx(auVar32,auVar32,0x7f);
      auVar26 = vrsqrtss_avx(auVar39,auVar39);
      fVar34 = auVar26._0_4_;
      fVar34 = fVar34 * 1.5 - fVar34 * fVar34 * fVar34 * auVar39._0_4_ * 0.5;
      auVar26._0_4_ = auVar32._0_4_ * fVar34;
      auVar26._4_4_ = auVar32._4_4_ * fVar34;
      auVar26._8_4_ = auVar32._8_4_ * fVar34;
      auVar26._12_4_ = auVar32._12_4_ * fVar34;
      auVar39._0_4_ = local_818[0] * auVar47._0_4_;
      auVar39._4_4_ = local_818[0] * auVar47._4_4_;
      auVar39._8_4_ = local_818[0] * auVar47._8_4_;
      auVar39._12_4_ = local_818[0] * auVar47._12_4_;
      auVar32 = vunpcklps_avx(auVar53,auVar39);
      auVar39 = vunpckhps_avx(auVar53,auVar39);
      auVar44 = vunpcklps_avx(auVar26,auVar45);
      auVar26 = vunpckhps_avx(auVar26,auVar45);
      local_7e8 = vunpcklps_avx(auVar39,auVar26);
      local_808 = vunpcklps_avx(auVar32,auVar44);
      local_7f8 = vunpckhps_avx(auVar32,auVar44);
      auVar26 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      puVar21 = local_7d0;
      auVar40._8_4_ = 0x7fffffff;
      auVar40._0_8_ = 0x7fffffff7fffffff;
      auVar40._12_4_ = 0x7fffffff;
      auVar39 = vandps_avx((undefined1  [16])aVar6,auVar40);
      auVar44._8_4_ = 0x219392ef;
      auVar44._0_8_ = 0x219392ef219392ef;
      auVar44._12_4_ = 0x219392ef;
      auVar39 = vcmpps_avx(auVar39,auVar44,1);
      auVar39 = vblendvps_avx((undefined1  [16])aVar6,auVar44,auVar39);
      auVar32 = vrcpps_avx(auVar39);
      auVar45._8_4_ = 0x3f800000;
      auVar45._0_8_ = 0x3f8000003f800000;
      auVar45._12_4_ = 0x3f800000;
      auVar39 = vfnmadd213ps_fma(auVar39,auVar32,auVar45);
      auVar45 = vfmadd132ps_fma(auVar39,auVar32,auVar32);
      fVar34 = auVar45._0_4_;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      auVar39 = vmovshdup_avx(auVar45);
      auVar32 = vshufpd_avx(auVar45,auVar45,1);
      auVar48._0_4_ = fVar34 * (ray->org).field_0.m128[0];
      auVar48._4_4_ = auVar45._4_4_ * (ray->org).field_0.m128[1];
      auVar48._8_4_ = auVar45._8_4_ * (ray->org).field_0.m128[2];
      auVar48._12_4_ = auVar45._12_4_ * (ray->org).field_0.m128[3];
      uVar23 = (ulong)(fVar34 < 0.0) * 0x10;
      uVar22 = (ulong)(auVar39._0_4_ < 0.0) << 4 | 0x20;
      auVar50._4_4_ = fVar34;
      auVar50._0_4_ = fVar34;
      auVar50._8_4_ = fVar34;
      auVar50._12_4_ = fVar34;
      auVar39 = vshufps_avx(auVar48,auVar48,0x55);
      auVar44 = vshufps_avx(auVar48,auVar48,0xaa);
      uVar20 = CONCAT44(auVar48._0_4_,auVar48._0_4_);
      auVar49._0_8_ = uVar20 ^ 0x8000000080000000;
      auVar49._8_4_ = -auVar48._0_4_;
      auVar49._12_4_ = -auVar48._0_4_;
      auVar41._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
      auVar41._8_4_ = auVar39._8_4_ ^ 0x80000000;
      auVar41._12_4_ = auVar39._12_4_ ^ 0x80000000;
      auVar46._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
      auVar46._8_4_ = auVar44._8_4_ ^ 0x80000000;
      auVar46._12_4_ = auVar44._12_4_ ^ 0x80000000;
      auVar39 = vshufps_avx(auVar45,auVar45,0x55);
      auVar44 = vshufps_avx(auVar45,auVar45,0xaa);
      uVar20 = (ulong)(auVar32._0_4_ < 0.0) << 4 | 0x40;
      uVar37 = auVar26._0_4_;
      auVar59._4_4_ = uVar37;
      auVar59._0_4_ = uVar37;
      auVar59._8_4_ = uVar37;
      auVar59._12_4_ = uVar37;
      auVar61._4_4_ = fVar1;
      auVar61._0_4_ = fVar1;
      auVar61._8_4_ = fVar1;
      auVar61._12_4_ = fVar1;
      uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uVar5 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
LAB_004b38d0:
      do {
        if (puVar21 == &local_7d8) {
          return;
        }
        uVar16 = puVar21[-1];
        puVar21 = puVar21 + -1;
        while ((uVar16 & 8) == 0) {
          fVar1 = (ray->dir).field_0.m128[3];
          uVar18 = (uint)uVar16 & 7;
          uVar15 = uVar16 & 0xfffffffffffffff0;
          if (uVar18 == 3) {
            auVar26 = *(undefined1 (*) [16])(uVar15 + 0x80);
            auVar32 = *(undefined1 (*) [16])(uVar15 + 0x90);
            fVar34 = 1.0 - fVar1;
            auVar51._0_4_ = fVar1 * *(float *)(uVar15 + 0xe0);
            auVar51._4_4_ = fVar1 * *(float *)(uVar15 + 0xe4);
            auVar51._8_4_ = fVar1 * *(float *)(uVar15 + 0xe8);
            auVar51._12_4_ = fVar1 * *(float *)(uVar15 + 0xec);
            auVar54._0_4_ = fVar1 * *(float *)(uVar15 + 0xf0);
            auVar54._4_4_ = fVar1 * *(float *)(uVar15 + 0xf4);
            auVar54._8_4_ = fVar1 * *(float *)(uVar15 + 0xf8);
            auVar54._12_4_ = fVar1 * *(float *)(uVar15 + 0xfc);
            auVar35._4_4_ = fVar34;
            auVar35._0_4_ = fVar34;
            auVar35._8_4_ = fVar34;
            auVar35._12_4_ = fVar34;
            auVar29._0_4_ = fVar1 * *(float *)(uVar15 + 0x100);
            auVar29._4_4_ = fVar1 * *(float *)(uVar15 + 0x104);
            auVar29._8_4_ = fVar1 * *(float *)(uVar15 + 0x108);
            auVar29._12_4_ = fVar1 * *(float *)(uVar15 + 0x10c);
            auVar45 = ZEXT816(0) << 0x40;
            auVar58 = vfmadd231ps_fma(auVar51,auVar35,auVar45);
            auVar7 = vfmadd231ps_fma(auVar54,auVar35,auVar45);
            auVar8 = vfmadd231ps_fma(auVar29,auVar35,auVar45);
            auVar56._0_4_ = fVar43 * auVar26._0_4_;
            auVar56._4_4_ = fVar43 * auVar26._4_4_;
            auVar56._8_4_ = fVar43 * auVar26._8_4_;
            auVar56._12_4_ = fVar43 * auVar26._12_4_;
            auVar60._0_4_ = fVar43 * auVar32._0_4_;
            auVar60._4_4_ = fVar43 * auVar32._4_4_;
            auVar60._8_4_ = fVar43 * auVar32._8_4_;
            auVar60._12_4_ = fVar43 * auVar32._12_4_;
            auVar12._4_4_ = uVar3;
            auVar12._0_4_ = uVar3;
            auVar12._8_4_ = uVar3;
            auVar12._12_4_ = uVar3;
            auVar45 = vfmadd231ps_fma(auVar56,auVar12,*(undefined1 (*) [16])(uVar15 + 0x50));
            auVar47 = vfmadd231ps_fma(auVar60,auVar12,*(undefined1 (*) [16])(uVar15 + 0x60));
            auVar13._4_4_ = uVar2;
            auVar13._0_4_ = uVar2;
            auVar13._8_4_ = uVar2;
            auVar13._12_4_ = uVar2;
            auVar48 = vfmadd231ps_fma(auVar45,auVar13,*(undefined1 (*) [16])(uVar15 + 0x20));
            auVar47 = vfmadd231ps_fma(auVar47,auVar13,*(undefined1 (*) [16])(uVar15 + 0x30));
            auVar45 = vandps_avx(auVar48,auVar40);
            auVar62._8_4_ = 0x219392ef;
            auVar62._0_8_ = 0x219392ef219392ef;
            auVar62._12_4_ = 0x219392ef;
            auVar45 = vcmpps_avx(auVar45,auVar62,1);
            auVar48 = vblendvps_avx(auVar48,auVar62,auVar45);
            auVar45 = vandps_avx(auVar47,auVar40);
            auVar45 = vcmpps_avx(auVar45,auVar62,1);
            auVar52 = vblendvps_avx(auVar47,auVar62,auVar45);
            auVar63._0_4_ = fVar1 * *(float *)(uVar15 + 0x110) + fVar34;
            auVar63._4_4_ = fVar1 * *(float *)(uVar15 + 0x114) + fVar34;
            auVar63._8_4_ = fVar1 * *(float *)(uVar15 + 0x118) + fVar34;
            auVar63._12_4_ = fVar1 * *(float *)(uVar15 + 0x11c) + fVar34;
            auVar45 = *(undefined1 (*) [16])(uVar15 + 0xa0);
            auVar27._0_4_ = auVar45._0_4_ * fVar43;
            auVar27._4_4_ = auVar45._4_4_ * fVar43;
            auVar27._8_4_ = auVar45._8_4_ * fVar43;
            auVar27._12_4_ = auVar45._12_4_ * fVar43;
            auVar47 = vfmadd231ps_fma(auVar27,auVar12,*(undefined1 (*) [16])(uVar15 + 0x70));
            auVar53 = vfmadd231ps_fma(auVar47,auVar13,*(undefined1 (*) [16])(uVar15 + 0x40));
            auVar47 = vandps_avx(auVar53,auVar40);
            auVar47 = vcmpps_avx(auVar47,auVar62,1);
            auVar47 = vblendvps_avx(auVar53,auVar62,auVar47);
            auVar53 = vrcpps_avx(auVar48);
            auVar30._8_4_ = 0x3f800000;
            auVar30._0_8_ = 0x3f8000003f800000;
            auVar30._12_4_ = 0x3f800000;
            auVar48 = vfnmadd213ps_fma(auVar48,auVar53,auVar30);
            auVar53 = vfmadd132ps_fma(auVar48,auVar53,auVar53);
            auVar48 = vrcpps_avx(auVar52);
            auVar52 = vfnmadd213ps_fma(auVar52,auVar48,auVar30);
            auVar55 = vfmadd132ps_fma(auVar52,auVar48,auVar48);
            auVar48 = vrcpps_avx(auVar47);
            auVar47 = vfnmadd213ps_fma(auVar47,auVar48,auVar30);
            auVar9._4_4_ = uVar5;
            auVar9._0_4_ = uVar5;
            auVar9._8_4_ = uVar5;
            auVar9._12_4_ = uVar5;
            auVar26 = vfmadd213ps_fma(auVar26,auVar9,*(undefined1 (*) [16])(uVar15 + 0xb0));
            auVar57 = vfmadd132ps_fma(auVar47,auVar48,auVar48);
            auVar10._4_4_ = uVar37;
            auVar10._0_4_ = uVar37;
            auVar10._8_4_ = uVar37;
            auVar10._12_4_ = uVar37;
            auVar47 = vfmadd231ps_fma(auVar26,auVar10,*(undefined1 (*) [16])(uVar15 + 0x50));
            auVar26 = vfmadd213ps_fma(auVar32,auVar9,*(undefined1 (*) [16])(uVar15 + 0xc0));
            auVar32 = vfmadd231ps_fma(auVar26,auVar10,*(undefined1 (*) [16])(uVar15 + 0x60));
            auVar26 = vfmadd213ps_fma(auVar45,auVar9,*(undefined1 (*) [16])(uVar15 + 0xd0));
            auVar26 = vfmadd231ps_fma(auVar26,auVar10,*(undefined1 (*) [16])(uVar15 + 0x70));
            auVar11._4_4_ = uVar4;
            auVar11._0_4_ = uVar4;
            auVar11._8_4_ = uVar4;
            auVar11._12_4_ = uVar4;
            auVar45 = vfmadd231ps_fma(auVar47,auVar11,*(undefined1 (*) [16])(uVar15 + 0x20));
            auVar47 = vfmadd231ps_fma(auVar32,auVar11,*(undefined1 (*) [16])(uVar15 + 0x30));
            auVar52 = vfmadd231ps_fma(auVar26,auVar11,*(undefined1 (*) [16])(uVar15 + 0x40));
            auVar26 = vsubps_avx(auVar58,auVar45);
            auVar32 = vsubps_avx(auVar63,auVar45);
            auVar45 = vsubps_avx(auVar7,auVar47);
            auVar7._4_4_ = fVar1 * *(float *)(uVar15 + 0x124) + fVar34;
            auVar7._0_4_ = fVar1 * *(float *)(uVar15 + 0x120) + fVar34;
            auVar7._8_4_ = fVar1 * *(float *)(uVar15 + 0x128) + fVar34;
            auVar7._12_4_ = fVar1 * *(float *)(uVar15 + 300) + fVar34;
            auVar47 = vsubps_avx(auVar7,auVar47);
            auVar48 = vsubps_avx(auVar8,auVar52);
            auVar8._4_4_ = fVar34 + fVar1 * *(float *)(uVar15 + 0x134);
            auVar8._0_4_ = fVar34 + fVar1 * *(float *)(uVar15 + 0x130);
            auVar8._8_4_ = fVar34 + fVar1 * *(float *)(uVar15 + 0x138);
            auVar8._12_4_ = fVar34 + fVar1 * *(float *)(uVar15 + 0x13c);
            auVar52 = vsubps_avx(auVar8,auVar52);
            auVar36._0_4_ = auVar53._0_4_ * auVar26._0_4_;
            auVar36._4_4_ = auVar53._4_4_ * auVar26._4_4_;
            auVar36._8_4_ = auVar53._8_4_ * auVar26._8_4_;
            auVar36._12_4_ = auVar53._12_4_ * auVar26._12_4_;
            auVar31._0_4_ = auVar53._0_4_ * auVar32._0_4_;
            auVar31._4_4_ = auVar53._4_4_ * auVar32._4_4_;
            auVar31._8_4_ = auVar53._8_4_ * auVar32._8_4_;
            auVar31._12_4_ = auVar53._12_4_ * auVar32._12_4_;
            auVar38._0_4_ = auVar55._0_4_ * auVar45._0_4_;
            auVar38._4_4_ = auVar55._4_4_ * auVar45._4_4_;
            auVar38._8_4_ = auVar55._8_4_ * auVar45._8_4_;
            auVar38._12_4_ = auVar55._12_4_ * auVar45._12_4_;
            auVar42._0_4_ = auVar48._0_4_ * auVar57._0_4_;
            auVar42._4_4_ = auVar48._4_4_ * auVar57._4_4_;
            auVar42._8_4_ = auVar48._8_4_ * auVar57._8_4_;
            auVar42._12_4_ = auVar48._12_4_ * auVar57._12_4_;
            auVar33._0_4_ = auVar55._0_4_ * auVar47._0_4_;
            auVar33._4_4_ = auVar55._4_4_ * auVar47._4_4_;
            auVar33._8_4_ = auVar55._8_4_ * auVar47._8_4_;
            auVar33._12_4_ = auVar55._12_4_ * auVar47._12_4_;
            auVar28._0_4_ = auVar52._0_4_ * auVar57._0_4_;
            auVar28._4_4_ = auVar52._4_4_ * auVar57._4_4_;
            auVar28._8_4_ = auVar52._8_4_ * auVar57._8_4_;
            auVar28._12_4_ = auVar52._12_4_ * auVar57._12_4_;
            auVar26 = vpminsd_avx(auVar38,auVar33);
            auVar32 = vpminsd_avx(auVar42,auVar28);
            auVar26 = vmaxps_avx(auVar26,auVar32);
            auVar48 = vpminsd_avx(auVar36,auVar31);
            auVar47 = vpmaxsd_avx(auVar36,auVar31);
            auVar32 = vpmaxsd_avx(auVar38,auVar33);
            auVar45 = vpmaxsd_avx(auVar42,auVar28);
            auVar45 = vminps_avx(auVar32,auVar45);
            auVar32 = vmaxps_avx(auVar59,auVar48);
            auVar26 = vmaxps_avx(auVar32,auVar26);
            auVar32 = vminps_avx(auVar61,auVar47);
            auVar32 = vminps_avx(auVar32,auVar45);
            auVar26 = vcmpps_avx(auVar26,auVar32,2);
          }
          else {
            auVar25._4_4_ = fVar1;
            auVar25._0_4_ = fVar1;
            auVar25._8_4_ = fVar1;
            auVar25._12_4_ = fVar1;
            auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + uVar23),auVar25,
                                      *(undefined1 (*) [16])(uVar15 + 0x20 + uVar23));
            auVar26 = vfmadd213ps_fma(auVar26,auVar50,auVar49);
            auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + uVar22),auVar25,
                                      *(undefined1 (*) [16])(uVar15 + 0x20 + uVar22));
            auVar32 = vfmadd213ps_fma(auVar32,auVar39,auVar41);
            auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + uVar20),auVar25,
                                      *(undefined1 (*) [16])(uVar15 + 0x20 + uVar20));
            auVar26 = vpmaxsd_avx(auVar26,auVar32);
            auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + (uVar23 ^ 0x10)),
                                      auVar25,*(undefined1 (*) [16])
                                               (uVar15 + 0x20 + (uVar23 ^ 0x10)));
            auVar47 = vfmadd213ps_fma(auVar45,auVar44,auVar46);
            auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + (uVar22 ^ 0x10)),
                                      auVar25,*(undefined1 (*) [16])
                                               (uVar15 + 0x20 + (uVar22 ^ 0x10)));
            auVar32 = vfmadd213ps_fma(auVar32,auVar50,auVar49);
            auVar45 = vfmadd213ps_fma(auVar45,auVar39,auVar41);
            auVar45 = vpminsd_avx(auVar32,auVar45);
            auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + (uVar20 ^ 0x10)),
                                      auVar25,*(undefined1 (*) [16])
                                               (uVar15 + 0x20 + (uVar20 ^ 0x10)));
            auVar48 = vfmadd213ps_fma(auVar32,auVar44,auVar46);
            auVar32 = vpmaxsd_avx(auVar47,auVar59);
            auVar26 = vpmaxsd_avx(auVar26,auVar32);
            auVar32 = vpminsd_avx(auVar48,auVar61);
            auVar32 = vpminsd_avx(auVar45,auVar32);
            if (uVar18 == 6) {
              auVar32 = vcmpps_avx(auVar26,auVar32,2);
              auVar26 = vcmpps_avx(*(undefined1 (*) [16])(uVar15 + 0xe0),auVar25,2);
              auVar45 = vcmpps_avx(auVar25,*(undefined1 (*) [16])(uVar15 + 0xf0),1);
              auVar26 = vandps_avx(auVar26,auVar45);
              auVar26 = vandps_avx(auVar26,auVar32);
            }
            else {
              auVar26 = vcmpps_avx(auVar26,auVar32,2);
            }
          }
          auVar26 = vpslld_avx(auVar26,0x1f);
          uVar18 = vmovmskps_avx(auVar26);
          if (uVar18 == 0) goto LAB_004b38d0;
          uVar18 = uVar18 & 0xff;
          lVar17 = 0;
          for (uVar16 = (ulong)uVar18; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000)
          {
            lVar17 = lVar17 + 1;
          }
          uVar16 = *(ulong *)(uVar15 + lVar17 * 8);
          uVar18 = uVar18 - 1 & uVar18;
          uVar19 = (ulong)uVar18;
          if (uVar18 != 0) {
            *puVar21 = uVar16;
            lVar17 = 0;
            for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar17 = lVar17 + 1;
            }
            uVar18 = uVar18 - 1 & uVar18;
            uVar19 = (ulong)uVar18;
            bVar24 = uVar18 == 0;
            while( true ) {
              puVar21 = puVar21 + 1;
              uVar16 = *(ulong *)(uVar15 + lVar17 * 8);
              if (bVar24) break;
              *puVar21 = uVar16;
              lVar17 = 0;
              for (uVar16 = uVar19; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                lVar17 = lVar17 + 1;
              }
              uVar19 = uVar19 - 1 & uVar19;
              bVar24 = uVar19 == 0;
            }
          }
        }
        cVar14 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar16 & 0xfffffffffffffff0) * 0x40 + 8))
                           (local_818,ray,context);
      } while (cVar14 == '\0');
      ray->tfar = -INFINITY;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }